

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::add_redundant_bytes(torrent *this,int b,waste_reason reason)

{
  long lVar1;
  long value;
  
  value = (long)b;
  lVar1 = this->m_total_redundant_bytes + value;
  if (0x7fffffffffffffff - value < this->m_total_redundant_bytes) {
    lVar1 = 0x7fffffffffffffff;
  }
  this->m_total_redundant_bytes = lVar1;
  counters::inc_stats_counter(this->m_stats_counters,0x88,value);
  counters::inc_stats_counter(this->m_stats_counters,reason + 0x79,value);
  return;
}

Assistant:

void torrent::add_redundant_bytes(int const b, waste_reason const reason)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(b > 0);
		TORRENT_ASSERT(static_cast<int>(reason) >= 0);
		TORRENT_ASSERT(static_cast<int>(reason) < static_cast<int>(waste_reason::max));

		if (m_total_redundant_bytes <= std::numeric_limits<std::int64_t>::max() - b)
			m_total_redundant_bytes += b;
		else
			m_total_redundant_bytes = std::numeric_limits<std::int64_t>::max();

		// the stats counters are 64 bits, so we don't check for overflow there
		m_stats_counters.inc_stats_counter(counters::recv_redundant_bytes, b);
		m_stats_counters.inc_stats_counter(counters::waste_piece_timed_out + static_cast<int>(reason), b);
	}